

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O2

string * read_untill_delimiters_abi_cxx11_
                   (string *__return_storage_ptr__,ifstream *f,
                   vector<char,_std::allocator<char>_> *delimiters)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined8 in_RAX;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_38 = in_RAX;
  while( true ) {
    pcVar1 = (delimiters->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (delimiters->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = std::istream::peek();
    uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (pcVar1,pcVar2,(long)&uStack_38 + 4);
    if (_Var4._M_current !=
        (delimiters->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    std::istream::get();
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_untill_delimiters(std::ifstream &f,
                                   const std::vector<char> &delimiters) {
  std::string ret_string;
  while (std::find(delimiters.begin(), delimiters.end(), f.peek()) ==
         delimiters.end()) {
    ret_string += f.get();
  }
  return ret_string;
}